

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::AssignmentExpression::fromSyntax
          (Compilation *compilation,BinaryExpressionSyntax *syntax,ASTContext *context)

{
  long lVar1;
  SourceRange sourceRange;
  SourceRange opRange;
  SourceRange opRange_00;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  bool bVar2;
  bool bVar3;
  int iVar4;
  TimingControlSyntax *pTVar5;
  undefined4 extraout_var;
  ExpressionSyntax *pEVar6;
  SyntaxNode *this;
  Expression *pEVar7;
  bitmask<slang::ast::ASTFlags> bVar8;
  SourceLocation SVar9;
  socklen_t __len;
  void *in_RDX;
  SyntaxKind *in_RSI;
  SourceRange SVar10;
  SourceRange SVar11;
  Expression *rhs;
  Expression *lhs;
  Expression *lhs_1;
  Expression *rhs_1;
  AssignmentPatternExpressionSyntax *pattern;
  TimingControlExpressionSyntax *tce;
  ASTContext timingCtx;
  TimingControl *timingControl;
  ExpressionSyntax *rightExpr;
  optional<slang::ast::BinaryOperator> op;
  bitmask<slang::ast::ASTFlags> extraFlags;
  bool isNonBlocking;
  bitmask<slang::ast::AssignFlags> assignFlags;
  undefined1 in_stack_0000082f;
  ExpressionSyntax *in_stack_00000830;
  ASTContext *in_stack_00000838;
  Expression *in_stack_fffffffffffffcf8;
  Compilation *in_stack_fffffffffffffd00;
  ASTContext *in_stack_fffffffffffffd08;
  ExpressionSyntax *in_stack_fffffffffffffd10;
  Compilation *in_stack_fffffffffffffd18;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffd20;
  SourceLocation in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  DiagCode code;
  Expression **in_stack_fffffffffffffd48;
  ASTContext *in_stack_fffffffffffffd50;
  byte local_201;
  bool local_1e1;
  undefined1 in_stack_fffffffffffffe20 [16];
  undefined1 in_stack_fffffffffffffe30 [16];
  bitmask<slang::ast::AssignFlags> in_stack_fffffffffffffe47;
  bitmask<slang::ast::AssignFlags> flags;
  _Optional_payload_base<slang::ast::BinaryOperator> in_stack_fffffffffffffe48;
  _Optional_payload_base<slang::ast::BinaryOperator> op_00;
  SourceLocation in_stack_fffffffffffffe60;
  SourceLocation SVar12;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffe68;
  SourceLocation in_stack_fffffffffffffe70;
  SourceLocation in_stack_fffffffffffffe78;
  ASTContext *in_stack_fffffffffffffe80;
  bitmask<slang::ast::ASTFlags> local_150;
  Type *in_stack_fffffffffffffeb8;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffec0;
  ExpressionSyntax *in_stack_fffffffffffffec8;
  Compilation *in_stack_fffffffffffffed0;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffed8;
  bitmask<slang::ast::ASTFlags> local_120;
  bitmask<slang::ast::ASTFlags> local_118;
  sockaddr local_110;
  bitmask<slang::ast::ASTFlags> abStack_100 [5];
  bitmask<slang::ast::ASTFlags> local_d8;
  undefined8 local_d0;
  ASTContext *local_c8;
  bitmask<slang::ast::ASTFlags> local_c0;
  BinaryOperator local_b4;
  _Optional_payload_base<slang::ast::BinaryOperator> local_b0;
  _Optional_payload_base<slang::ast::BinaryOperator> local_a8;
  bitmask<slang::ast::ASTFlags> local_a0;
  SourceRange local_98;
  undefined4 local_84;
  SourceRange local_80;
  undefined4 local_6c;
  bitmask<slang::ast::ASTFlags> local_68;
  bitmask<slang::ast::ASTFlags> local_60;
  bitmask<slang::ast::ASTFlags> local_58;
  SourceRange local_50;
  undefined4 local_3c;
  bitmask<slang::ast::ASTFlags> local_38;
  bitmask<slang::ast::AssignFlags> local_2b;
  byte local_2a;
  bitmask<slang::ast::AssignFlags> local_29;
  void *local_28;
  SyntaxKind *local_20;
  Expression *local_10;
  
  code = SUB84((ulong)in_stack_fffffffffffffd30 >> 0x20,0);
  local_28 = in_RDX;
  local_20 = in_RSI;
  bitmask<slang::ast::AssignFlags>::bitmask(&local_29);
  local_2a = *local_20 == NonblockingAssignmentExpression;
  if ((bool)local_2a) {
    bitmask<slang::ast::AssignFlags>::bitmask(&local_2b,NonBlocking);
    local_29.m_bits = local_2b.m_bits;
  }
  local_1e1 = false;
  if ((local_2a & 1) != 0) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_38,Final);
    local_1e1 = bitmask<slang::ast::ASTFlags>::has
                          ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffd10,
                           (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffd08);
  }
  if (local_1e1 == false) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_58,AssignmentAllowed);
    bVar2 = bitmask<slang::ast::ASTFlags>::has
                      ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffd10,
                       (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffd08);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_a0,None);
      std::optional<slang::ast::BinaryOperator>::optional
                ((optional<slang::ast::BinaryOperator> *)0x9e0f4b);
      if ((*local_20 == AssignmentExpression) || (*local_20 == NonblockingAssignmentExpression)) {
        bitmask<slang::ast::ASTFlags>::bitmask(&local_c0,StreamingAllowed);
        bitmask<slang::ast::ASTFlags>::operator|=(&local_a0,&local_c0);
      }
      else {
        local_b4 = OpInfo::getBinary(*local_20);
        std::optional<slang::ast::BinaryOperator>::optional<slang::ast::BinaryOperator,_true>
                  ((optional<slang::ast::BinaryOperator> *)in_stack_fffffffffffffd00,
                   &in_stack_fffffffffffffcf8->kind);
        local_a8 = local_b0;
      }
      local_c8 = (ASTContext *)
                 not_null::operator_cast_to_ExpressionSyntax_
                           ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9e0fdd);
      local_d0 = 0;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_d8,TopLevelStatement);
      bVar3 = bitmask<slang::ast::ASTFlags>::has
                        ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffd10,
                         (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffd08);
      bVar2 = false;
      if (bVar3) {
        bVar2 = ((SyntaxNode *)&local_c8->scope)->kind == TimingControlExpression;
      }
      if (bVar2) {
        memcpy(&local_110,local_28,0x38);
        bitmask<slang::ast::ASTFlags>::bitmask(&local_118,LValue);
        bitmask<slang::ast::ASTFlags>::operator|=(abStack_100,&local_118);
        if ((local_2a & 1) != 0) {
          bitmask<slang::ast::ASTFlags>::bitmask(&local_120,NonBlockingTimingControl);
          bitmask<slang::ast::ASTFlags>::operator|=(abStack_100,&local_120);
        }
        in_stack_fffffffffffffed8.m_bits =
             (underlying_type)
             slang::syntax::SyntaxNode::as<slang::syntax::TimingControlExpressionSyntax>
                       ((SyntaxNode *)local_c8);
        pTVar5 = not_null<slang::syntax::TimingControlSyntax_*>::operator*
                           ((not_null<slang::syntax::TimingControlSyntax_*> *)0x9e1106);
        iVar4 = TimingControl::bind((int)pTVar5,&local_110,__len);
        local_d0 = CONCAT44(extraout_var,iVar4);
        local_c8 = (ASTContext *)
                   not_null::operator_cast_to_ExpressionSyntax_
                             ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9e112f);
      }
      pEVar6 = not_null<slang::syntax::ExpressionSyntax_*>::operator->
                         ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9e1148);
      if (((pEVar6->super_SyntaxNode).kind == AssignmentPatternExpression) &&
         (((SyntaxNode *)&local_c8->scope)->kind != StreamingConcatenationExpression)) {
        this = &not_null<slang::syntax::ExpressionSyntax_*>::operator->
                          ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9e1176)->
                super_SyntaxNode;
        in_stack_fffffffffffffed0 =
             (Compilation *)
             slang::syntax::SyntaxNode::as<slang::syntax::AssignmentPatternExpressionSyntax>(this);
        lVar1._0_4_ = (in_stack_fffffffffffffed0->options).maxCheckerInstanceDepth;
        lVar1._4_4_ = (in_stack_fffffffffffffed0->options).maxGenerateSteps;
        if (lVar1 == 0) {
          bitmask<slang::ast::ASTFlags>::bitmask
                    ((bitmask<slang::ast::ASTFlags> *)&stack0xfffffffffffffec0,None);
          pEVar7 = Expression::selfDetermined
                             (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                              in_stack_fffffffffffffd08,in_stack_fffffffffffffd20);
          not_null<slang::syntax::ExpressionSyntax_*>::operator*
                    ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9e1228);
          bitmask<slang::ast::ASTFlags>::bitmask(&local_150,LValue);
          not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0x9e1263);
          Expression::create(in_stack_fffffffffffffed0,(ExpressionSyntax *)pEVar7,
                             (ASTContext *)in_stack_fffffffffffffec0.m_bits,
                             in_stack_fffffffffffffed8,in_stack_fffffffffffffeb8);
          Expression::selfDetermined(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
          parsing::Token::range((Token *)in_stack_fffffffffffffd20.m_bits);
          SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffd50);
          opRange.endLoc = (SourceLocation)in_stack_fffffffffffffe68.m_bits;
          opRange.startLoc = in_stack_fffffffffffffe60;
          sourceRange_00.endLoc = in_stack_fffffffffffffe78;
          sourceRange_00.startLoc = in_stack_fffffffffffffe70;
          pEVar7 = fromComponents(in_stack_fffffffffffffe30._8_8_,
                                  (optional<slang::ast::BinaryOperator>)in_stack_fffffffffffffe48,
                                  in_stack_fffffffffffffe47,in_stack_fffffffffffffe30._0_8_,
                                  in_stack_fffffffffffffe20._8_8_,opRange,
                                  in_stack_fffffffffffffe20._0_8_,sourceRange_00,
                                  (ASTContext *)SVar10.startLoc);
          return pEVar7;
        }
      }
      not_null<slang::syntax::ExpressionSyntax_*>::operator*
                ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9e13e4);
      bitmask<slang::ast::ASTFlags>::bitmask
                ((bitmask<slang::ast::ASTFlags> *)&stack0xfffffffffffffe68,LValue);
      bVar8 = bitmask<slang::ast::ASTFlags>::operator|
                        ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffd08,
                         (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffd00);
      SVar9 = (SourceLocation)
              Expression::selfDetermined
                        (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                         in_stack_fffffffffffffd08,in_stack_fffffffffffffd20);
      SVar12 = (SourceLocation)0x0;
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x9e1466)
      ;
      bVar2 = Type::isVirtualInterfaceOrArray((Type *)in_stack_fffffffffffffd00);
      if (bVar2) {
        SVar12 = (SourceLocation)
                 Expression::tryBindInterfaceRef
                           (in_stack_00000838,in_stack_00000830,(bool)in_stack_0000082f);
      }
      if (SVar12 == (SourceLocation)0x0) {
        if ((*(int *)SVar9 == 0x11) &&
           (((SyntaxNode *)&local_c8->scope)->kind != StreamingConcatenationExpression)) {
          SVar12 = (SourceLocation)
                   Expression::selfDetermined
                             (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                              in_stack_fffffffffffffd08,in_stack_fffffffffffffd20);
        }
        else {
          in_stack_fffffffffffffd50 = local_c8;
          not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0x9e1546);
          SVar12 = (SourceLocation)
                   Expression::create(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                                      (ASTContext *)in_stack_fffffffffffffec0.m_bits,
                                      in_stack_fffffffffffffed8,in_stack_fffffffffffffeb8);
        }
      }
      flags.m_bits = local_29.m_bits;
      op_00 = local_a8;
      SVar10 = parsing::Token::range((Token *)in_stack_fffffffffffffd20.m_bits);
      SVar11 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffd50);
      opRange_00.endLoc = (SourceLocation)in_stack_fffffffffffffe68.m_bits;
      opRange_00.startLoc = SVar12;
      sourceRange_01.endLoc = SVar9;
      sourceRange_01.startLoc = (SourceLocation)bVar8.m_bits;
      local_10 = fromComponents((Compilation *)SVar10.endLoc,
                                (optional<slang::ast::BinaryOperator>)op_00,flags,
                                (Expression *)SVar10.startLoc,(Expression *)SVar11.endLoc,opRange_00
                                ,(TimingControl *)SVar11.startLoc,sourceRange_01,
                                in_stack_fffffffffffffe80);
    }
    else {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_60,NonProcedural);
      bVar2 = bitmask<slang::ast::ASTFlags>::has
                        ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffd10,
                         (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffd08);
      local_201 = 0;
      if (!bVar2) {
        bitmask<slang::ast::ASTFlags>::bitmask(&local_68,AssignmentDisallowed);
        bVar2 = bitmask<slang::ast::ASTFlags>::has
                          ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffd10,
                           (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffd08);
        local_201 = bVar2 ^ 0xff;
      }
      if ((local_201 & 1) == 0) {
        local_84 = 0xb0007;
        local_98 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffd50);
        sourceRange.endLoc = in_stack_fffffffffffffd28;
        sourceRange.startLoc = (SourceLocation)in_stack_fffffffffffffd20.m_bits;
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffd18,code,sourceRange);
      }
      else {
        local_6c = 0x170007;
        local_80 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffd50);
        SVar11.endLoc = in_stack_fffffffffffffd28;
        SVar11.startLoc = (SourceLocation)in_stack_fffffffffffffd20.m_bits;
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffd18,code,SVar11);
      }
      local_10 = Expression::badExpr(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    }
  }
  else {
    local_3c = 0xcb0007;
    local_50 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffd50);
    SVar10.endLoc = in_stack_fffffffffffffd28;
    SVar10.startLoc = (SourceLocation)in_stack_fffffffffffffd20.m_bits;
    ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffd18,code,SVar10);
    local_10 = Expression::badExpr(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  }
  return local_10;
}

Assistant:

Expression& AssignmentExpression::fromSyntax(Compilation& compilation,
                                             const BinaryExpressionSyntax& syntax,
                                             const ASTContext& context) {
    bitmask<AssignFlags> assignFlags;
    bool isNonBlocking = syntax.kind == SyntaxKind::NonblockingAssignmentExpression;
    if (isNonBlocking)
        assignFlags = AssignFlags::NonBlocking;

    if (isNonBlocking && context.flags.has(ASTFlags::Final)) {
        context.addDiag(diag::NonblockingInFinal, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    if (!context.flags.has(ASTFlags::AssignmentAllowed)) {
        if (!context.flags.has(ASTFlags::NonProcedural) &&
            !context.flags.has(ASTFlags::AssignmentDisallowed)) {
            context.addDiag(diag::AssignmentRequiresParens, syntax.sourceRange());
        }
        else {
            context.addDiag(diag::AssignmentNotAllowed, syntax.sourceRange());
        }
        return badExpr(compilation, nullptr);
    }

    bitmask<ASTFlags> extraFlags = ASTFlags::None;
    std::optional<BinaryOperator> op;
    if (syntax.kind != SyntaxKind::AssignmentExpression &&
        syntax.kind != SyntaxKind::NonblockingAssignmentExpression) {
        op = OpInfo::getBinary(syntax.kind);
    }
    else {
        extraFlags |= ASTFlags::StreamingAllowed;
    }

    const ExpressionSyntax* rightExpr = syntax.right;

    // If we're in a top-level statement, check for an intra-assignment timing control.
    // Otherwise, we'll let this fall through to the default handler which will issue an error.
    const TimingControl* timingControl = nullptr;
    if (context.flags.has(ASTFlags::TopLevelStatement) &&
        rightExpr->kind == SyntaxKind::TimingControlExpression) {

        ASTContext timingCtx = context;
        timingCtx.flags |= ASTFlags::LValue;
        if (isNonBlocking)
            timingCtx.flags |= ASTFlags::NonBlockingTimingControl;

        auto& tce = rightExpr->as<TimingControlExpressionSyntax>();
        timingControl = &TimingControl::bind(*tce.timing, timingCtx);
        rightExpr = tce.expr;
    }

    // The right hand side of an assignment expression is typically an
    // "assignment-like context", except if the left hand side does not
    // have a self-determined type. That can only be true if the lhs is
    // an assignment pattern without an explicit type.
    // However, streaming concatenation has no explicit type either so it is excluded and such right
    // hand side will lead to diag::AssignmentPatternNoContext error later.
    if (syntax.left->kind == SyntaxKind::AssignmentPatternExpression &&
        rightExpr->kind != SyntaxKind::StreamingConcatenationExpression) {
        auto& pattern = syntax.left->as<AssignmentPatternExpressionSyntax>();
        if (!pattern.type) {
            // In this case we have to bind the rhs first to determine the
            // correct type to use as the context for the lhs.
            auto rhs = &selfDetermined(compilation, *rightExpr, context);
            auto lhs = &create(compilation, *syntax.left, context, ASTFlags::LValue, rhs->type);
            selfDetermined(context, lhs);

            return fromComponents(compilation, op, assignFlags, *lhs, *rhs,
                                  syntax.operatorToken.range(), timingControl, syntax.sourceRange(),
                                  context);
        }
    }

    auto& lhs = selfDetermined(compilation, *syntax.left, context, extraFlags | ASTFlags::LValue);

    Expression* rhs = nullptr;
    if (lhs.type->isVirtualInterfaceOrArray())
        rhs = tryBindInterfaceRef(context, *rightExpr, /* isInterfacePort */ false);

    if (!rhs) {
        // When LHS is a streaming concatenation which has no explicit type, RHS should be
        // self-determined and we cannot pass lsh.type to it. When both LHS and RHS are streaming
        // concatenations, pass lhs.type to notify RHS to exclude associative arrays for
        // isBitstreamType check, while RHS can still be self-determined by ignoring lhs type
        // information.
        if (lhs.kind == ExpressionKind::Streaming &&
            rightExpr->kind != SyntaxKind::StreamingConcatenationExpression) {
            rhs = &selfDetermined(compilation, *rightExpr, context, extraFlags);
        }
        else {
            rhs = &create(compilation, *rightExpr, context, extraFlags, lhs.type);
        }
    }

    return fromComponents(compilation, op, assignFlags, lhs, *rhs, syntax.operatorToken.range(),
                          timingControl, syntax.sourceRange(), context);
}